

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

FieldDescriptor ** google::protobuf::compiler::java::SortFieldsByNumber(Descriptor *descriptor)

{
  uint uVar1;
  FieldDescriptor **ppFVar2;
  long lVar3;
  ulong uVar4;
  FieldDescriptor **ppFVar5;
  long lVar6;
  
  uVar1 = *(uint *)(descriptor + 4);
  lVar6 = (long)(int)uVar1;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar4 = lVar6 * 8;
  }
  ppFVar2 = (FieldDescriptor **)operator_new__(uVar4);
  lVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  ppFVar5 = ppFVar2;
  for (; uVar4 * 0x48 - lVar3 != 0; lVar3 = lVar3 + 0x48) {
    *ppFVar5 = (FieldDescriptor *)(*(long *)(descriptor + 0x28) + lVar3);
    ppFVar5 = ppFVar5 + 1;
  }
  std::
  __sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::FieldOrderingByNumber>>
            (ppFVar2,ppFVar2 + lVar6);
  return ppFVar2;
}

Assistant:

const FieldDescriptor** SortFieldsByNumber(const Descriptor* descriptor) {
  const FieldDescriptor** fields =
      new const FieldDescriptor*[descriptor->field_count()];
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  std::sort(fields, fields + descriptor->field_count(),
            FieldOrderingByNumber());
  return fields;
}